

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write_significand<fmt::v8::appender,char>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<char>_> this;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDI;
  char in_R8B;
  appender *in_stack_ffffffffffffffb8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_ffffffffffffffc0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_8;
  
  local_8.container =
       (buffer<char> *)
       copy_str_noinline<char,char_const*,fmt::v8::appender>
                 (in_stack_ffffffffffffffc0.container,(char *)in_stack_ffffffffffffffb8,
                  in_RDI.container);
  if (in_R8B != '\0') {
    this.container = (buffer<char> *)appender::operator++(in_stack_ffffffffffffffb8,0);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*
              ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)&stack0xffffffffffffffc0);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)this.container,
               (value_type_conflict1 *)in_stack_ffffffffffffffb8);
    local_8.container =
         (buffer<char> *)
         copy_str_noinline<char,char_const*,fmt::v8::appender>
                   (this.container,(char *)local_8.container,in_RDI.container);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_8.container;
}

Assistant:

inline auto write_significand(OutputIt out, const char* significand,
                              int significand_size, int integral_size,
                              Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}